

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngshim.c
# Opt level: O0

void convert_bytes_to_data(png_structp png,png_row_infop row_info,png_bytep data)

{
  png_byte pVar1;
  png_bytep ppVar2;
  uint blue;
  uint green;
  uint red;
  uchar *base;
  uint i;
  png_bytep data_local;
  png_row_infop row_info_local;
  png_structp png_local;
  
  for (base._4_4_ = 0; (ulong)base._4_4_ < row_info->rowbytes; base._4_4_ = base._4_4_ + 4) {
    ppVar2 = data + base._4_4_;
    pVar1 = *ppVar2;
    *ppVar2 = ppVar2[2];
    ppVar2[1] = ppVar2[1];
    ppVar2[2] = pVar1;
    ppVar2[3] = 0xff;
  }
  return;
}

Assistant:

static void
  convert_bytes_to_data( png_structp    png,
                         png_row_infop  row_info,
                         png_bytep      data )
  {
    unsigned int  i;

    FT_UNUSED( png );


    for ( i = 0; i < row_info->rowbytes; i += 4 )
    {
      unsigned char*  base  = &data[i];
      unsigned int    red   = base[0];
      unsigned int    green = base[1];
      unsigned int    blue  = base[2];


      base[0] = (unsigned char)blue;
      base[1] = (unsigned char)green;
      base[2] = (unsigned char)red;
      base[3] = 0xFF;
    }
  }